

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::comment(spec *s)

{
  either *in_RDI;
  either *in_stack_ffffffffffffffa0;
  character *in_stack_ffffffffffffffa8;
  sequence *in_stack_ffffffffffffffb0;
  
  character::character((character *)in_RDI,(char_type)((ulong)in_RDI >> 0x38));
  allowed_comment_char(s);
  repeat_at_least::repeat_at_least<toml::detail::either>
            ((repeat_at_least *)in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
  sequence::sequence<toml::detail::character,toml::detail::repeat_at_least>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (repeat_at_least *)in_stack_ffffffffffffffa0);
  repeat_at_least::~repeat_at_least((repeat_at_least *)in_RDI);
  either::~either(in_RDI);
  character::~character((character *)0x64ddd2);
  return (sequence *)in_RDI;
}

Assistant:

TOML11_INLINE sequence comment(const spec& s)
{
    return sequence(character(char_type('#')),
                    repeat_at_least(0, allowed_comment_char(s)));
}